

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

int __thiscall llvm::StringMapImpl::FindKey(StringMapImpl *this,StringRef Key)

{
  StringMapEntryBase *pSVar1;
  uint uVar2;
  StringMapEntryBase *pSVar3;
  char *__s2;
  uint32_t in_ECX;
  bool bVar4;
  StringRef Buffer;
  undefined1 local_108 [16];
  StringMapImpl *local_f8;
  char *local_f0;
  char *local_e8;
  char *ItemStr;
  StringMapEntryBase *BucketItem;
  StringMapEntryBase **ppSStack_d0;
  uint ProbeAmt;
  uint *HashTable;
  StringMapImpl *pSStack_c0;
  uint BucketNo;
  char *local_b8;
  uint32_t local_b0;
  uint local_ac;
  uint FullHashValue;
  uint HTSize;
  StringMapImpl *this_local;
  StringRef Key_local;
  StringMapImpl *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  StringMapImpl **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  StringMapImpl *local_18;
  int local_c;
  
  local_b8 = (char *)Key.Length;
  pSStack_c0 = (StringMapImpl *)Key.Data;
  local_ac = this->NumBuckets;
  if (local_ac != 0) {
    Buffer.Length = 0;
    Buffer.Data = local_b8;
    _FullHashValue = this;
    this_local = pSStack_c0;
    Key_local.Data = local_b8;
    local_b0 = djbHash((llvm *)pSStack_c0,Buffer,in_ECX);
    ppSStack_d0 = this->TheTable + (ulong)this->NumBuckets + 1;
    BucketItem._4_4_ = 1;
    HashTable._4_4_ = local_b0 & local_ac - 1;
    while (pSVar1 = this->TheTable[HashTable._4_4_], pSVar1 != (StringMapEntryBase *)0x0) {
      ItemStr = (char *)pSVar1;
      pSVar3 = getTombstoneVal();
      if ((pSVar1 != pSVar3) &&
         (*(uint32_t *)((long)ppSStack_d0 + (ulong)HashTable._4_4_ * 4) == local_b0)) {
        __s2 = ItemStr + this->ItemSize;
        local_f8 = this_local;
        local_f0 = Key_local.Data;
        local_e8 = __s2;
        local_58 = (char *)StringMapEntryBase::getKeyLength((StringMapEntryBase *)ItemStr);
        local_48 = local_108;
        local_68 = local_f8;
        local_60 = local_f0;
        local_40 = &local_68;
        bVar4 = false;
        local_50 = __s2;
        local_38 = __s2;
        local_30 = local_58;
        if (local_f0 == local_58) {
          local_18 = local_f8;
          local_28 = local_58;
          local_20 = __s2;
          if (local_58 == (char *)0x0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(local_f8,__s2,(size_t)local_58);
          }
          bVar4 = local_c == 0;
        }
        if (bVar4) {
          return HashTable._4_4_;
        }
      }
      uVar2 = HashTable._4_4_ + BucketItem._4_4_;
      BucketItem._4_4_ = BucketItem._4_4_ + 1;
      HashTable._4_4_ = uVar2 & local_ac - 1;
    }
  }
  return -1;
}

Assistant:

int StringMapImpl::FindKey(StringRef Key) const {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) return -1;  // Really empty table?
  unsigned FullHashValue = djbHash(Key, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return.
    if (LLVM_LIKELY(!BucketItem))
      return -1;

    if (BucketItem == getTombstoneVal()) {
      // Ignore tombstones.
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because NameStart isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Key == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}